

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O2

ScriptContextProfiler * __thiscall
NativeCodeGenerator::EnsureForegroundCodeGenProfiler(NativeCodeGenerator *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContextProfiler *pSVar4;
  
  bVar2 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,ProfileFlag);
  if (bVar2) {
    pSVar4 = this->foregroundCodeGenProfiler;
    if (pSVar4 == (ScriptContextProfiler *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                         ,0xd75,"(this->foregroundCodeGenProfiler != nullptr)",
                         "this->foregroundCodeGenProfiler != nullptr");
      if (!bVar2) goto LAB_0058d5fe;
      *puVar3 = 0;
      pSVar4 = this->foregroundCodeGenProfiler;
    }
    if (pSVar4->profilerArena == (ArenaAllocator *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                         ,0xd76,"(this->foregroundCodeGenProfiler->IsInitialized())",
                         "this->foregroundCodeGenProfiler->IsInitialized()");
      if (!bVar2) {
LAB_0058d5fe:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  return this->foregroundCodeGenProfiler;
}

Assistant:

Js::ScriptContextProfiler *
NativeCodeGenerator::EnsureForegroundCodeGenProfiler()
{
    if (Js::Configuration::Global.flags.IsEnabled(Js::ProfileFlag))
    {
        Assert(this->foregroundCodeGenProfiler != nullptr);
        Assert(this->foregroundCodeGenProfiler->IsInitialized());
    }

    return this->foregroundCodeGenProfiler;
}